

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::SPxMainSM<double>::duplicateRows(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  VectorBase<double> *__x;
  VectorBase<double> *__x_00;
  int *piVar1;
  pointer pDVar2;
  double *pdVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  DataKey *pDVar8;
  char cVar9;
  undefined1 auVar10 [16];
  DuplicateRowsPS *pDVar11;
  Result RVar12;
  long lVar13;
  pointer pDVar14;
  undefined7 uVar16;
  undefined8 extraout_RAX;
  SPxOut *pSVar15;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  SVectorBase<double> *pSVar20;
  ulong uVar21;
  int iVar22;
  int *piVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  Item *pIVar27;
  ulong uVar28;
  ulong uVar29;
  DSVectorBase<double> *this_00;
  long lVar30;
  long in_FS_OFFSET;
  double dVar31;
  double dVar32;
  Real RVar33;
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int *perm_tmp;
  undefined4 local_2ac;
  undefined1 local_2a8 [16];
  int *perm;
  bool *local_288;
  Real local_280;
  int local_278;
  undefined4 uStack_274;
  undefined8 uStack_270;
  double local_260;
  double local_258;
  undefined8 uStack_250;
  DuplicateRowsPS *local_248;
  Verbosity old_verbosity_1;
  int iStack_23c;
  int *local_238;
  Real local_230;
  int *idxMem;
  int local_21c;
  Item *local_218;
  undefined8 uStack_210;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  double local_1e8;
  Verbosity old_verbosity;
  Verbosity local_1cc;
  int *local_1c8;
  undefined8 local_1c0;
  Item *local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  ulong local_1a0;
  DataArray<bool> local_198;
  DataArray<bool> local_180;
  int local_164;
  int local_160;
  int local_15c;
  Array<double> scale;
  Array<double> local_128;
  Array<double> local_110;
  ElementCompare compare;
  bool *local_f0;
  undefined8 local_e8;
  shared_ptr<soplex::Tolerances> local_e0;
  shared_ptr<soplex::Tolerances> local_d0;
  VectorBase<double> newRhsVec;
  VectorBase<double> newLhsVec;
  int *local_88;
  undefined8 local_80;
  bool *local_78;
  ulong local_70;
  ulong local_68;
  DataArray<int> local_60;
  DataArray<int> local_48;
  
  iVar24 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  RVar12 = removeEmpty(this,lp);
  if (RVar12 == OKAY) {
    old_verbosity = ERROR;
    local_1cc = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    if ((int)local_1cc < 1) {
      RVar12 = OKAY;
    }
    else {
      iVar22 = 0;
      do {
        pIVar27 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
        iVar42 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                 [(int)old_verbosity].idx;
        if (pIVar27[iVar42].data.super_SVectorBase<double>.memused == 1) {
          removeRowSingleton(this,lp,(SVectorBase<double> *)(pIVar27 + iVar42),(int *)&old_verbosity
                            );
          iVar22 = iVar22 + 1;
          local_1cc = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        }
        old_verbosity = old_verbosity + WARNING;
      } while ((int)old_verbosity < (int)local_1cc);
      if (((0 < iVar22) &&
          (pSVar15 = (this->super_SPxSimplifier<double>).spxout, pSVar15 != (SPxOut *)0x0)) &&
         (old_verbosity = pSVar15->m_verbosity, 3 < (int)old_verbosity)) {
        (*pSVar15->_vptr_SPxOut[2])();
        pSVar15 = (this->super_SPxSimplifier<double>).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity],
                   "Simplifier duplicate rows (row singleton stage) removed ",0x38);
        std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity]," non-zeros",10);
        cVar9 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        pSVar15 = (this->super_SPxSimplifier<double>).spxout;
        (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity);
        local_1cc = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      RVar12 = OKAY;
      if (1 < (int)local_1cc) {
        local_1c8 = (int *)0x0;
        local_1c0 = 0x3ff3333333333333;
        old_verbosity = local_1cc;
        spx_alloc<int*>(&local_1c8,local_1cc);
        iVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        local_88 = (int *)0x0;
        local_80 = 0x3ff3333333333333;
        iVar42 = 0;
        if (0 < iVar22) {
          iVar42 = iVar22;
        }
        iVar25 = 1;
        if (0 < iVar22) {
          iVar25 = iVar42;
        }
        spx_alloc<int*>(&local_88,iVar25);
        Array<double>::Array
                  (&scale,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
        idxMem = (int *)0x0;
        local_15c = iVar24;
        local_78 = again;
        spx_alloc<int*>(&idxMem,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum)
        ;
        piVar23 = idxMem;
        *local_1c8 = 0;
        *scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 0.0;
        iVar24 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        *local_88 = iVar24;
        iVar22 = 0;
        if (1 < iVar24) {
          lVar26 = 1;
          iVar22 = 0;
          do {
            local_1c8[lVar26] = 0;
            scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar26] = 0.0;
            local_88[lVar26] = 0;
            idxMem[lVar26 + -1] = (int)lVar26;
            lVar26 = lVar26 + 1;
            iVar22 = iVar22 + 1;
          } while (lVar26 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
        }
        if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
          lVar26 = 0;
          local_1b8 = (Item *)0x0;
          uStack_1b0 = 0;
          do {
            pIVar27 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
            local_278 = (int)lVar26;
            uStack_274 = (undefined4)((ulong)lVar26 >> 0x20);
            iVar24 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar26].idx
            ;
            if (0 < pIVar27[iVar24].data.super_SVectorBase<double>.memused) {
              local_218 = pIVar27 + iVar24;
              lVar30 = 8;
              lVar26 = 0;
              do {
                pNVar5 = (local_218->data).super_SVectorBase<double>.m_elem;
                dVar31 = *(double *)((long)pNVar5 + lVar30 + -8);
                iVar24 = *(int *)((long)&pNVar5->val + lVar30);
                dVar36 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                if ((dVar36 == 0.0) && (!NAN(dVar36))) {
                  scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] = dVar31;
                  dVar36 = dVar31;
                }
                this_00 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_1c8[iVar24];
                DSVectorBase<double>::makeMem(this_00,1);
                dVar31 = dVar31 / dVar36;
                if ((dVar31 != 0.0) || (NAN(dVar31))) {
                  iVar42 = (this_00->super_SVectorBase<double>).memused;
                  pNVar5 = (this_00->super_SVectorBase<double>).m_elem;
                  pNVar5[iVar42].idx = iVar24;
                  pNVar5[iVar42].val = dVar31;
                  (this_00->super_SVectorBase<double>).memused = iVar42 + 1;
                }
                piVar1 = local_88 + local_1c8[iVar24];
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == 0) {
                  lVar18 = (long)iVar22;
                  iVar22 = iVar22 + 1;
                  piVar23[lVar18] = local_1c8[iVar24];
                }
                lVar26 = lVar26 + 1;
                iVar24 = (local_218->data).super_SVectorBase<double>.memused;
                uVar19 = (ulong)iVar24;
                lVar30 = lVar30 + 0x10;
              } while (lVar26 < (long)uVar19);
              if (0 < iVar24) {
                pDVar14 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar26 = 0;
                pIVar27 = local_218;
                do {
                  iVar24 = local_1c8[(pIVar27->data).super_SVectorBase<double>.m_elem[lVar26].idx];
                  if (0 < pDVar14[iVar24].super_SVectorBase<double>.memused) {
                    pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var7 = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                      }
                    }
                    compare.epsiloncompare = Tolerances::epsilon(pTVar6);
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                    }
                    pDVar14 = (this->m_classSetRows).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    iVar42 = pDVar14[iVar24].super_SVectorBase<double>.memused;
                    if (1 < iVar42) {
                      SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                                (pDVar14[iVar24].super_SVectorBase<double>.m_elem,iVar42,&compare,0,
                                 true);
                      pDVar14 = (this->m_classSetRows).data.
                                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    iVar42 = *piVar23;
                    lVar30 = (long)iVar22;
                    iVar22 = iVar22 + -1;
                    *piVar23 = piVar23[lVar30 + -1];
                    if (0 < pDVar14[iVar24].super_SVectorBase<double>.memused) {
                      pSVar20 = &pDVar14[iVar24].super_SVectorBase<double>;
                      lVar18 = 0;
                      lVar30 = 0;
                      do {
                        if (lVar18 != 0) {
                          dVar31 = *(double *)((long)&pSVar20->m_elem->val + lVar18);
                          dVar32 = epsZero(this);
                          uVar19 = (ulong)DAT_005f4110;
                          dVar36 = (double)((ulong)dVar31 & uVar19);
                          if (dVar36 <= (double)((ulong)local_1b8 & uVar19)) {
                            dVar36 = (double)((ulong)local_1b8 & uVar19);
                          }
                          if (dVar36 <= 1.0) {
                            dVar36 = 1.0;
                          }
                          if (dVar32 < (double)((ulong)((dVar31 - (double)local_1b8) / dVar36) &
                                               uVar19)) {
                            iVar42 = *piVar23;
                            lVar13 = (long)iVar22;
                            iVar22 = iVar22 + -1;
                            *piVar23 = piVar23[lVar13 + -1];
                          }
                        }
                        pDVar14 = (this->m_classSetRows).data.
                                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pSVar20 = &pDVar14[iVar24].super_SVectorBase<double>;
                        pNVar5 = pSVar20->m_elem;
                        local_1c8[*(int *)((long)&pNVar5->idx + lVar18)] = iVar42;
                        local_88[iVar42] = local_88[iVar42] + 1;
                        local_1b8 = *(Item **)((long)&pNVar5->val + lVar18);
                        uStack_1b0 = 0;
                        lVar30 = lVar30 + 1;
                        lVar18 = lVar18 + 0x10;
                      } while (lVar30 < pDVar14[iVar24].super_SVectorBase<double>.memused);
                    }
                    pDVar14[iVar24].super_SVectorBase<double>.memused = 0;
                    uVar19 = (ulong)(uint)(local_218->data).super_SVectorBase<double>.memused;
                    pIVar27 = local_218;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 < (int)uVar19);
              }
            }
            lVar26 = CONCAT44(uStack_274,local_278) + 1;
          } while (lVar26 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
        }
        free(idxMem);
        idxMem = (int *)0x0;
        iVar24 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        local_f0 = (bool *)0x0;
        local_e8 = 0x3ff3333333333333;
        compare.epsiloncompare._0_4_ = 0;
        if (0 < iVar24) {
          compare.epsiloncompare._0_4_ = iVar24;
        }
        compare.epsiloncompare._4_4_ = 1;
        if (0 < iVar24) {
          compare.epsiloncompare._4_4_ = compare.epsiloncompare._0_4_;
        }
        spx_alloc<bool*>(&local_f0,compare.epsiloncompare._4_4_);
        auVar10 = _DAT_005f41b0;
        auVar40 = _DAT_005f4040;
        iVar24 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        uVar19 = (ulong)iVar24;
        if (0 < (long)uVar19) {
          pDVar14 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar26 = uVar19 - 1;
          auVar35._8_4_ = (int)lVar26;
          auVar35._0_8_ = lVar26;
          auVar35._12_4_ = (int)((ulong)lVar26 >> 0x20);
          lVar26 = 0;
          auVar35 = auVar35 ^ _DAT_005f4040;
          auVar37 = _DAT_005f4020;
          auVar39 = _DAT_005f4030;
          do {
            auVar41 = auVar39 ^ auVar40;
            iVar22 = auVar35._4_4_;
            if ((bool)(~(auVar41._4_4_ == iVar22 && auVar35._0_4_ < auVar41._0_4_ ||
                        iVar22 < auVar41._4_4_) & 1)) {
              *(undefined4 *)((long)&(pDVar14->super_SVectorBase<double>).memused + lVar26) = 0;
            }
            if ((auVar41._12_4_ != auVar35._12_4_ || auVar41._8_4_ <= auVar35._8_4_) &&
                auVar41._12_4_ <= auVar35._12_4_) {
              *(undefined4 *)((long)&pDVar14[1].super_SVectorBase<double>.memused + lVar26) = 0;
            }
            auVar41 = auVar37 ^ auVar40;
            iVar42 = auVar41._4_4_;
            if (iVar42 <= iVar22 && (iVar42 != iVar22 || auVar41._0_4_ <= auVar35._0_4_)) {
              *(undefined4 *)((long)&pDVar14[2].super_SVectorBase<double>.memused + lVar26) = 0;
              *(undefined4 *)((long)&pDVar14[3].super_SVectorBase<double>.memused + lVar26) = 0;
            }
            lVar30 = auVar39._8_8_;
            lVar18 = auVar10._0_8_;
            auVar39._0_8_ = auVar39._0_8_ + lVar18;
            lVar13 = auVar10._8_8_;
            auVar39._8_8_ = lVar30 + lVar13;
            lVar30 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + lVar18;
            auVar37._8_8_ = lVar30 + lVar13;
            lVar26 = lVar26 + 0x80;
          } while ((ulong)(iVar24 + 3U >> 2) << 7 != lVar26);
          if (0 < iVar24) {
            lVar26 = 0;
            do {
              local_f0[lVar26] = false;
              DSVectorBase<double>::makeMem
                        ((this->m_dupRows).data.
                         super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_1c8[lVar26],1);
              lVar26 = lVar26 + 1;
              uVar19 = (ulong)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
            } while (lVar26 < (long)uVar19);
          }
        }
        perm_tmp = (int *)0x0;
        iVar24 = (int)uVar19;
        spx_alloc<int*>(&perm_tmp,iVar24);
        uVar21 = uVar19 & 0xffffffff;
        if (0 < iVar24) {
          memset(perm_tmp,0,uVar21 * 4);
        }
        iVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar22 < 1) {
          uVar29 = 0xffffffff;
          local_1a0 = 0xffffffff;
        }
        else {
          pDVar14 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar27 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pDVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey;
          uVar29 = 0xffffffff;
          uVar28 = 0;
          uVar17 = 0xffffffff;
          do {
            if ((1 < pDVar14[uVar28].super_SVectorBase<double>.memused) &&
               (pNVar5 = pDVar14[uVar28].super_SVectorBase<double>.m_elem,
               pIVar27[pDVar8[pNVar5->idx].idx].data.super_SVectorBase<double>.memused != 1)) {
              if ((int)uVar17 < 0) {
                uVar17 = (uint)uVar28;
              }
              piVar23 = &pNVar5[1].idx;
              lVar26 = 1;
              do {
                perm_tmp[*piVar23] = -1;
                lVar26 = lVar26 + 1;
                piVar23 = piVar23 + 4;
              } while (lVar26 < pDVar14[uVar28].super_SVectorBase<double>.memused);
              iVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
              uVar29 = uVar28 & 0xffffffff;
            }
            uVar28 = uVar28 + 1;
          } while ((long)uVar28 < (long)iVar22);
          local_1a0 = (ulong)uVar17;
        }
        if (0 < iVar24) {
          uVar28 = 0;
          iVar22 = 0;
          do {
            if (-1 < perm_tmp[uVar28]) {
              perm_tmp[uVar28] = iVar22;
              iVar22 = iVar22 + 1;
            }
            uVar28 = uVar28 + 1;
          } while (uVar21 != uVar28);
        }
        __x = &(lp->super_LPRowSetBase<double>).left;
        std::vector<double,_std::allocator<double>_>::vector(&newLhsVec.val,&__x->val);
        __x_00 = &(lp->super_LPRowSetBase<double>).right;
        std::vector<double,_std::allocator<double>_>::vector(&newRhsVec.val,&__x_00->val);
        uVar17 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (0 < (int)uVar17) {
          dVar31 = *(double *)(in_FS_OFFSET + -8);
          local_160 = iVar24;
          if (iVar24 < 1) {
            iVar24 = 1;
            local_160 = 0;
          }
          local_218 = (Item *)((ulong)dVar31 ^ 0x8000000000000000);
          uStack_210 = 0x8000000000000000;
          uVar28 = 0;
          local_1a8 = 0;
          local_164 = iVar24;
          local_70 = uVar21;
          local_68 = uVar19;
          do {
            pDVar14 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar24 = pDVar14[uVar28].super_SVectorBase<double>.memused;
            if ((1 < iVar24) &&
               ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
                [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                 [(pDVar14[uVar28].super_SVectorBase<double>.m_elem)->idx].idx].data.
                super_SVectorBase<double>.memused != 1)) {
              piVar23 = (this->m_stat).data;
              uVar17 = (iVar24 + piVar23[0xc]) - 1;
              uVar19 = (ulong)uVar17;
              piVar23[0xc] = uVar17;
              ::soplex::infinity::__tls_init();
              ::soplex::infinity::__tls_init();
              iVar24 = (this->m_dupRows).data.
                       super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar28].super_SVectorBase<double>.
                       memused;
              local_288 = (bool *)0x0;
              local_280 = 1.2;
              iVar22 = iVar24;
              if (iVar24 < 1) {
                iVar22 = 0;
                iVar24 = 1;
              }
              perm = (int *)CONCAT44(iVar24,iVar22);
              spx_alloc<bool*>(&local_288,iVar24);
              pDVar14 = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_2ac = (undefined4)CONCAT71((int7)(uVar19 >> 8),1);
              if (0 < pDVar14[uVar28].super_SVectorBase<double>.memused) {
                pDVar2 = pDVar14 + uVar28;
                iVar24 = -1;
                lVar30 = 8;
                lVar26 = 0;
                local_1b8 = local_218;
                iVar22 = -1;
                iVar42 = -1;
                local_1e8 = dVar31;
                do {
                  iVar25 = *(int *)((long)&((pDVar2->super_SVectorBase<double>).m_elem)->val +
                                   lVar30);
                  pIVar27 = (Item *)(__x->val).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar25];
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = pIVar27;
                  dVar36 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[iVar25];
                  local_288[lVar26] = (double)pIVar27 == dVar36;
                  if (iVar42 != -1) {
                    local_258 = scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar42] /
                                scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar25];
                    local_278 = iVar42;
                    if (local_258 <= 0.0) {
                      local_2a8._0_8_ = dVar36;
                      ::soplex::infinity::__tls_init();
                      if (dVar31 <= (double)local_2a8._0_8_) {
                        ::soplex::infinity::__tls_init();
                        local_2a8._0_8_ = local_218;
                        local_2a8._8_8_ = uStack_210;
                      }
                      else {
                        local_2a8._0_8_ =
                             (Item *)((__x_00->val).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar25] * local_258);
                        local_2a8._8_8_ = 0;
                      }
                      local_260 = (__x->val).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar25];
                      ::soplex::infinity::__tls_init();
                      if ((double)local_218 < local_260) {
                        dVar36 = local_258 *
                                 (__x->val).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar25];
                        goto LAB_001ef49d;
                      }
                      ::soplex::infinity::__tls_init();
LAB_001ef4c9:
                      dVar36 = dVar31;
                    }
                    else {
                      local_2a8 = auVar40;
                      ::soplex::infinity::__tls_init();
                      if ((double)local_2a8._0_8_ <= (double)local_218) {
                        ::soplex::infinity::__tls_init();
                        local_2a8._0_8_ = local_218;
                        local_2a8._8_8_ = uStack_210;
                      }
                      else {
                        local_2a8._0_8_ =
                             (Item *)((__x->val).super__Vector_base<double,_std::allocator<double>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar25] * local_258)
                        ;
                        local_2a8._8_8_ = 0;
                      }
                      local_260 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar25];
                      ::soplex::infinity::__tls_init();
                      if (dVar31 <= local_260) {
                        ::soplex::infinity::__tls_init();
                        goto LAB_001ef4c9;
                      }
                      dVar36 = local_258 *
                               (__x_00->val).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar25];
LAB_001ef49d:
                    }
                    if ((double)local_1b8 < (double)local_2a8._0_8_) {
                      iVar22 = iVar25;
                    }
                    if (dVar36 < local_1e8) {
                      iVar24 = iVar25;
                    }
                    pIVar27 = (Item *)local_2a8._0_8_;
                    if ((double)local_2a8._0_8_ <= (double)local_1b8) {
                      pIVar27 = local_1b8;
                    }
                    if (local_1e8 <= dVar36) {
                      dVar36 = local_1e8;
                    }
                    local_f0[iVar25] = true;
                    pDVar14 = (this->m_dupRows).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    iVar25 = local_278;
                  }
                  local_1b8 = pIVar27;
                  local_1e8 = dVar36;
                  iVar42 = iVar25;
                  uVar21 = local_68;
                  uVar19 = local_70;
                  lVar26 = lVar26 + 1;
                  pDVar2 = pDVar14 + uVar28;
                  lVar30 = lVar30 + 0x10;
                } while (lVar26 < (pDVar2->super_SVectorBase<double>).memused);
                if (iVar42 != -1) {
                  local_260 = (double)CONCAT44(local_260._4_4_,iVar24);
                  lVar26 = (long)iVar42;
                  pIVar27 = (Item *)(__x->val).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar26];
                  pIVar4 = local_1b8;
                  if ((double)local_1b8 <= (double)pIVar27) {
                    pIVar4 = pIVar27;
                  }
                  local_278 = (int)pIVar4;
                  uStack_274 = (undefined4)((ulong)pIVar4 >> 0x20);
                  uStack_270 = 0;
                  local_2a8._0_8_ = lVar26;
                  dVar36 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar26];
                  local_258 = local_1e8;
                  if (dVar36 <= local_1e8) {
                    local_258 = dVar36;
                  }
                  uStack_250 = 0;
                  local_21c = iVar22;
                  if (uVar28 == uVar29) {
                    local_238 = (int *)0x0;
                    local_230 = 1.2;
                    iStack_23c = local_164;
                    old_verbosity_1 = local_160;
                    spx_alloc<int*>(&local_238,local_164);
                    if (0 < (int)uVar21) {
                      uVar21 = 0;
                      do {
                        local_238[uVar21] = perm_tmp[uVar21];
                        uVar21 = uVar21 + 1;
                      } while (uVar19 != uVar21);
                    }
                    local_248 = (DuplicateRowsPS *)operator_new(0xd0);
                    pDVar14 = (this->m_dupRows).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    Array<double>::Array(&local_110,&scale);
                    DataArray<int>::DataArray(&local_48,(DataArray<int> *)&old_verbosity_1);
                    local_180.thesize = (uint)perm;
                    local_180.themax = perm._4_4_;
                    local_180.data = (bool *)0x0;
                    local_180.memFactor = local_280;
                    spx_alloc<bool*>(&local_180.data,perm._4_4_);
                    if ((ulong)(uint)local_180.thesize != 0) {
                      memcpy(local_180.data,local_288,(ulong)(uint)local_180.thesize);
                    }
                    pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var7 = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                      }
                    }
                    RVar33 = Tolerances::epsilon(pTVar6);
                    pDVar11 = local_248;
                    dVar36 = (double)(CONCAT44(uStack_274,local_278) & (ulong)DAT_005f4110);
                    dVar32 = (double)((ulong)local_258 & (ulong)DAT_005f4110);
                    if (dVar36 <= dVar32) {
                      dVar36 = dVar32;
                    }
                    if (dVar36 <= 1.0) {
                      dVar36 = 1.0;
                    }
                    local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_d0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_d0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    DuplicateRowsPS::DuplicateRowsPS
                              (local_248,lp,iVar42,local_21c,local_260._0_4_,pDVar14 + uVar29,
                               &local_110,&local_48,&local_180,true,
                               ABS(((double)CONCAT44(uStack_274,local_278) - local_258) / dVar36) <=
                               RVar33,&local_d0,(int)uVar29 == (int)local_1a0);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = &pDVar11->super_PostStep;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<double>::DuplicateRowsPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,pDVar11);
                    if (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_d0.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                    }
                    if (local_180.data != (bool *)0x0) {
                      free(local_180.data);
                      local_180.data = (bool *)0x0;
                    }
                    if (local_48.data != (int *)0x0) {
                      free(local_48.data);
                      local_48.data = (int *)0x0;
                    }
                    if (local_110.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_110.data.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start,
                                      (long)local_110.data.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_110.data.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                    ::push_back(&(this->m_hist).data,&ptr);
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  else {
                    local_238 = (int *)0x0;
                    local_230 = 1.2;
                    old_verbosity_1 = 0;
                    iStack_23c = 1;
                    spx_alloc<int*>(&local_238,1);
                    local_248 = (DuplicateRowsPS *)operator_new(0xd0);
                    pDVar14 = (this->m_dupRows).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    Array<double>::Array(&local_128,&scale);
                    DataArray<int>::DataArray(&local_60,(DataArray<int> *)&old_verbosity_1);
                    local_198.thesize = (uint)perm;
                    local_198.themax = perm._4_4_;
                    local_198.data = (bool *)0x0;
                    local_198.memFactor = local_280;
                    spx_alloc<bool*>(&local_198.data,perm._4_4_);
                    if ((ulong)(uint)local_198.thesize != 0) {
                      memcpy(local_198.data,local_288,(ulong)(uint)local_198.thesize);
                    }
                    pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var7 = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                      }
                    }
                    RVar33 = Tolerances::epsilon(pTVar6);
                    pDVar11 = local_248;
                    dVar36 = (double)(CONCAT44(uStack_274,local_278) & (ulong)DAT_005f4110);
                    dVar32 = (double)((ulong)local_258 & (ulong)DAT_005f4110);
                    if (dVar36 <= dVar32) {
                      dVar36 = dVar32;
                    }
                    if (dVar36 <= 1.0) {
                      dVar36 = 1.0;
                    }
                    local_e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_e0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_e0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    DuplicateRowsPS::DuplicateRowsPS
                              (local_248,lp,iVar42,local_21c,local_260._0_4_,pDVar14 + uVar28,
                               &local_128,&local_60,&local_198,false,
                               ABS(((double)CONCAT44(uStack_274,local_278) - local_258) / dVar36) <=
                               RVar33,&local_e0,uVar28 == local_1a0);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = &pDVar11->super_PostStep;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<double>::DuplicateRowsPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,pDVar11);
                    if (local_e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_e0.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                    }
                    if (local_198.data != (bool *)0x0) {
                      free(local_198.data);
                      local_198.data = (bool *)0x0;
                    }
                    if (local_60.data != (int *)0x0) {
                      free(local_60.data);
                      local_60.data = (int *)0x0;
                    }
                    if (local_128.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_128.data.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start,
                                      (long)local_128.data.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_128.data.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                    ::push_back(&(this->m_hist).data,&ptr);
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  if (local_238 != (int *)0x0) {
                    free(local_238);
                  }
                  pdVar3 = (__x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + local_2a8._0_8_;
                  if ((*pdVar3 <= (double)local_1b8 && (double)local_1b8 != *pdVar3) ||
                     (local_1e8 <
                      (__x_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_2a8._0_8_])) {
                    dVar34 = feastol(this);
                    dVar32 = (double)((ulong)local_258 & (ulong)DAT_005f4110);
                    dVar36 = (double)CONCAT44(uStack_274,local_278);
                    dVar38 = (double)((ulong)dVar36 & (ulong)DAT_005f4110);
                    if (dVar32 <= dVar38) {
                      dVar32 = dVar38;
                    }
                    if (dVar32 <= 1.0) {
                      dVar32 = 1.0;
                    }
                    if ((local_258 - dVar36) / dVar32 <= -dVar34) {
                      free(perm_tmp);
                      perm_tmp = (int *)0x0;
                      local_1a8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                      local_2ac = 0;
                    }
                    else {
                      newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_2a8._0_8_] = dVar36;
                      if (dVar36 <= local_258) {
                        dVar36 = local_258;
                      }
                      newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_2a8._0_8_] = dVar36;
                      uVar16 = (undefined7)
                               ((ulong)newRhsVec.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 8);
                      local_2ac = (undefined4)CONCAT71(uVar16,1);
                      local_1a8 = CONCAT71(uVar16,1);
                    }
                  }
                }
              }
              if (local_288 != (bool *)0x0) {
                free(local_288);
              }
              if ((char)local_2ac == '\0') {
                RVar12 = INFEASIBLE;
                goto LAB_001eff1f;
              }
              uVar17 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
            }
            uVar28 = uVar28 + 1;
          } while ((long)uVar28 < (long)(int)uVar17);
          if ((local_1a8 & 1) != 0) {
            (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x38])
                      (lp,&newLhsVec,&newRhsVec);
            uVar17 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          }
        }
        perm = (int *)0x0;
        spx_alloc<int*>(&perm,uVar17);
        if ((int)uVar17 < 1) {
          iVar22 = 0;
          iVar24 = 0;
        }
        else {
          pIVar27 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pDVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey;
          uVar19 = 0;
          iVar24 = 0;
          iVar22 = 0;
          do {
            if (local_f0[uVar19] == true) {
              perm[uVar19] = -1;
              iVar24 = iVar24 + 1;
              iVar22 = iVar22 + pIVar27[pDVar8[uVar19].idx].data.super_SVectorBase<double>.memused;
            }
            else {
              perm[uVar19] = 0;
            }
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
        }
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x11])(lp,perm);
        if (0 < (int)uVar17) {
          piVar23 = (this->m_rIdx).data;
          uVar19 = 0;
          do {
            if (-1 < (long)perm[uVar19]) {
              piVar23[perm[uVar19]] = piVar23[uVar19];
            }
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
        }
        free(perm);
        RVar12 = OKAY;
        perm = (int *)0x0;
        free(perm_tmp);
        perm_tmp = (int *)0x0;
        if (iVar24 + iVar22 != 0 && SCARRY4(iVar24,iVar22) == iVar24 + iVar22 < 0) {
          piVar23 = &(this->super_SPxSimplifier<double>).m_remRows;
          *piVar23 = *piVar23 + iVar24;
          piVar23 = &(this->super_SPxSimplifier<double>).m_remNzos;
          *piVar23 = *piVar23 + iVar22;
          pSVar15 = (this->super_SPxSimplifier<double>).spxout;
          if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
            old_verbosity_1 = pSVar15->m_verbosity;
            ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     CONCAT44(ptr.
                              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,4);
            (*pSVar15->_vptr_SPxOut[2])();
            pSVar15 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                         "Simplifier (duplicate rows) removed ");
            std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar24);
            pSVar15 = soplex::operator<<(pSVar15," rows, ");
            std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar22);
            pSVar15 = soplex::operator<<(pSVar15," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar15->m_streams[pSVar15->m_verbosity]);
            pSVar15 = (this->super_SPxSimplifier<double>).spxout;
            (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity_1);
          }
          if ((double)local_15c * (this->super_SPxSimplifier<double>).m_minReduction <
              (double)iVar24) {
            *local_78 = true;
          }
        }
LAB_001eff1f:
        if (newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_f0 != (bool *)0x0) {
          free(local_f0);
        }
        if (scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_88 != (int *)0x0) {
          free(local_88);
        }
        if (local_1c8 != (int *)0x0) {
          free(local_1c8);
        }
      }
    }
  }
  return RVar12;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}